

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

void __thiscall testing::Matcher<char>::Matcher(Matcher<char> *this,char value)

{
  EqMatcher local_29;
  MatcherBase<char> local_28;
  
  (this->super_MatcherBase<char>).impl_.value_ = (MatcherInterface<char> *)0x0;
  (this->super_MatcherBase<char>).impl_.link_.next_ = &(this->super_MatcherBase<char>).impl_.link_;
  (this->super_MatcherBase<char>)._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_001b9d98;
  local_29 = (EqMatcher)value;
  internal::EqMatcher::operator_cast_to_Matcher((Matcher<char> *)&local_28,&local_29);
  internal::linked_ptr<const_testing::MatcherInterface<char>_>::operator=
            (&(this->super_MatcherBase<char>).impl_,&local_28.impl_);
  internal::MatcherBase<char>::~MatcherBase(&local_28);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }